

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O3

Hop_Obj_t * Kit_GraphToHopInternal(Hop_Man_t *pMan,Kit_Graph_t *pGraph)

{
  Kit_Edge_t KVar1;
  uint uVar2;
  Kit_Node_t *pKVar3;
  Hop_Obj_t *pHVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  KVar1 = pGraph->eRoot;
  if (pGraph->fConst == 0) {
    uVar7 = (ulong)(uint)pGraph->nLeaves;
    uVar5 = (uint)KVar1 >> 1 & 0x3fffffff;
    if (uVar5 < (uint)pGraph->nLeaves) {
      pHVar4 = (Hop_Obj_t *)((ulong)((uint)KVar1 & 1) ^ (ulong)pGraph->pNodes[uVar5].field_2.pFunc);
    }
    else {
      lVar6 = uVar7 * 0x18 + 8;
      do {
        pKVar3 = pGraph->pNodes;
        uVar5 = *(uint *)((long)pKVar3 + lVar6 + -8);
        uVar2 = *(uint *)((long)pKVar3 + lVar6 + -4);
        pHVar4 = Hop_And(pMan,(Hop_Obj_t *)
                              ((ulong)(uVar5 & 1) ^
                              (ulong)pKVar3[uVar5 >> 1 & 0x3fffffff].field_2.pFunc),
                         (Hop_Obj_t *)
                         ((ulong)(uVar2 & 1) ^ (ulong)pKVar3[uVar2 >> 1 & 0x3fffffff].field_2.pFunc)
                        );
        *(Hop_Obj_t **)(&(pKVar3->eEdge0).field_0x0 + lVar6) = pHVar4;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x18;
      } while ((long)uVar7 < (long)pGraph->nSize);
      pHVar4 = (Hop_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pHVar4);
    }
  }
  else {
    pHVar4 = (Hop_Obj_t *)((ulong)((uint)KVar1 & 1) ^ (ulong)pMan->pConst1);
  }
  return pHVar4;
}

Assistant:

Hop_Obj_t * Kit_GraphToHopInternal( Hop_Man_t * pMan, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL;
    Hop_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Hop_NotCond( Hop_ManConst1(pMan), Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Hop_NotCond( (Hop_Obj_t *)Kit_GraphVar(pGraph)->pFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Hop_NotCond( (Hop_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Hop_NotCond( (Hop_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Hop_And( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Hop_NotCond( (Hop_Obj_t *)pNode->pFunc, Kit_GraphIsComplement(pGraph) );
}